

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O2

void GETTOPVAL(char *string)

{
  LispPTR LAddr;
  LispPTR *pLVar1;
  
  LAddr = MAKEATOM(string);
  if (LAddr != 0xffffffff) {
    if ((LAddr & 0xfff0000) == 0) {
      pLVar1 = (LispPTR *)(AtomSpace + (long)(int)(LAddr * 5) * 2);
    }
    else {
      pLVar1 = NativeAligned4FromLAddr(LAddr);
    }
    print(pLVar1[1]);
    return;
  }
  printf("\'%s\': no such symbol.\n",string);
  return;
}

Assistant:

void GETTOPVAL(char *string) {
  int index;
  LispPTR *cell68k;

  index = MAKEATOM(string);
  if (index != -1) /* Only print if there's such an atom */
  {
    cell68k = (LispPTR *)GetVALCELL68k(index);
    print(*cell68k);
  } else
    printf("'%s': no such symbol.\n", string);
}